

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void stream_encoder_mt_end(void *coder_ptr,lzma_allocator *allocator)

{
  undefined8 *puVar1;
  
  threads_end((lzma_stream_coder_conflict1 *)coder_ptr,allocator);
  lzma_outq_end((lzma_outq *)((long)coder_ptr + 0x100),allocator);
  for (puVar1 = (undefined8 *)((long)coder_ptr + 0x18); puVar1[-1] != -1; puVar1 = puVar1 + 2) {
    lzma_free((void *)*puVar1,allocator);
  }
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x68),allocator);
  lzma_index_end(*(lzma_index **)((long)coder_ptr + 0x60),allocator);
  mythread_cond_destroy((mythread_cond *)((long)coder_ptr + 400));
  mythread_mutex_destroy((mythread_mutex *)((long)coder_ptr + 0x168));
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
stream_encoder_mt_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_stream_coder *coder = coder_ptr;

	// Threads must be killed before the output queue can be freed.
	threads_end(coder, allocator);
	lzma_outq_end(&coder->outq, allocator);

	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	mythread_cond_destroy(&coder->cond);
	mythread_mutex_destroy(&coder->mutex);

	lzma_free(coder, allocator);
	return;
}